

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall
irr::video::COpenGL3DriverBase::draw2DImage
          (COpenGL3DriverBase *this,ITexture *texture,u32 layer,bool flip)

{
  bool bVar1;
  long lVar2;
  S3DVertex quad2DVertices [4];
  undefined8 auStack_c4 [2];
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined8 local_90;
  float local_88;
  undefined8 local_84;
  undefined4 local_7c;
  undefined8 local_6c;
  float local_64;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_48;
  float local_40;
  undefined8 local_3c;
  undefined4 local_34;
  undefined8 local_24;
  float local_1c;
  
  if (texture != (ITexture *)0x0) {
    uStack_b0 = 0x1f5126;
    chooseMaterial2D(this);
    (this->Material).TextureLayers[0].Texture = texture;
    uStack_b0 = 0x1f5144;
    bVar1 = COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
            ::STextureCache::set(&this->CacheHandler->TextureCache,0,texture,EST_ACTIVE_ALWAYS);
    if (bVar1) {
      uStack_b0 = 0x1f5163;
      setRenderStates2DMode(this,false,true,true);
      lVar2 = 0x1c;
      do {
        *(undefined8 *)((long)auStack_c4 + lVar2) = 0;
        *(undefined8 *)((long)auStack_c4 + lVar2 + 8) = 0;
        *(undefined8 *)(&stack0xffffffffffffff4c + lVar2) = 0;
        *(undefined4 *)((long)&uStack_b0 + lVar2 + 4) = 0xffffffff;
        *(undefined8 *)((long)&local_a8 + lVar2) = 0;
        lVar2 = lVar2 + 0x24;
      } while (lVar2 != 0xac);
      local_a8 = 0x3f800000bf800000;
      uStack_a0 = 0;
      local_84 = 0x3f8000003f800000;
      local_7c = 0;
      local_60 = 0xbf8000003f800000;
      local_58 = 0;
      local_3c = 0xbf800000bf800000;
      local_34 = 0;
      local_88 = 1.0;
      if (!flip) {
        local_88 = 0.0;
      }
      local_40 = 1.0 - local_88;
      local_90 = 0xffffffff;
      local_6c = 0x3f800000ffffffff;
      local_48 = 0x3f800000ffffffff;
      local_24 = 0xffffffff;
      uStack_b0 = 0x1f523f;
      local_64 = local_88;
      local_1c = local_40;
      drawArrays(this,6,(VertexType *)vt2DImage,&local_a8,4);
    }
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DImage(const video::ITexture *texture, u32 layer, bool flip)
{
	if (!texture)
		return;

	chooseMaterial2D();
	if (!setMaterialTexture(0, texture))
		return;

	setRenderStates2DMode(false, true, true);

	S3DVertex quad2DVertices[4];

	quad2DVertices[0].Pos = core::vector3df(-1.f, 1.f, 0.f);
	quad2DVertices[1].Pos = core::vector3df(1.f, 1.f, 0.f);
	quad2DVertices[2].Pos = core::vector3df(1.f, -1.f, 0.f);
	quad2DVertices[3].Pos = core::vector3df(-1.f, -1.f, 0.f);

	f32 modificator = (flip) ? 1.f : 0.f;

	quad2DVertices[0].TCoords = core::vector2df(0.f, 0.f + modificator);
	quad2DVertices[1].TCoords = core::vector2df(1.f, 0.f + modificator);
	quad2DVertices[2].TCoords = core::vector2df(1.f, 1.f - modificator);
	quad2DVertices[3].TCoords = core::vector2df(0.f, 1.f - modificator);

	quad2DVertices[0].Color = SColor(0xFFFFFFFF);
	quad2DVertices[1].Color = SColor(0xFFFFFFFF);
	quad2DVertices[2].Color = SColor(0xFFFFFFFF);
	quad2DVertices[3].Color = SColor(0xFFFFFFFF);

	drawQuad(vt2DImage, quad2DVertices);
}